

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_XXX.cpp
# Opt level: O2

bool __thiscall EnvironmentXXX::InitializeEnv(EnvironmentXXX *this,char *sEnvFile)

{
  FILE *__stream;
  SBPL_Exception *this_00;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  __stream = fopen(sEnvFile,"r");
  if (__stream != (FILE *)0x0) {
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1c])(this,__stream);
    fclose(__stream);
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1d])(this);
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x23])(this);
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x25])(this);
    return true;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"ERROR: unable to open ",&local_1c9);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&local_1c8,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::operator<<(local_198,sEnvFile);
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  SBPL_Exception::SBPL_Exception(this_00,&local_1c8);
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool EnvironmentXXX::InitializeEnv(const char* sEnvFile)
{
    FILE* fCfg = fopen(sEnvFile, "r");
    if (fCfg == NULL) {
        std::stringstream ss("ERROR: unable to open ");
        ss << sEnvFile;
        throw SBPL_Exception(ss.str());
    }
    ReadConfiguration(fCfg);
    fclose(fCfg);

    //Initialize other parameters of the environment
    InitializeEnvConfig();

    //initialize Environment
    InitializeEnvironment();

    //pre-compute heuristics
    ComputeHeuristicValues();

    return true;
}